

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCSat2.c
# Opt level: O1

int Cbs2_ManAnalyze(Cbs2_Man_t *p,int Level,int iVar,int iFan0,int iFan1)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  char *pcVar4;
  int iVar5;
  int *piVar6;
  int *piVar7;
  ulong uVar8;
  
  if ((-1 < iVar) && (iVar < (p->vAssign).nSize)) {
    if ('\x01' < (p->vAssign).pArray[(uint)iVar]) {
      __assert_fail("Cbs2_VarIsAssigned(p, iVar)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaCSat2.c"
                    ,0x310,"int Cbs2_ManAnalyze(Cbs2_Man_t *, int, int, int, int)");
    }
    iVar5 = (p->pClauses).iTail;
    if ((p->pClauses).iHead != iVar5) {
      __assert_fail("Cbs2_QueIsEmpty( pQue )",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaCSat2.c"
                    ,0x311,"int Cbs2_ManAnalyze(Cbs2_Man_t *, int, int, int, int)");
    }
    iVar1 = (p->pClauses).nSize;
    if (iVar5 == iVar1) {
      (p->pClauses).nSize = iVar1 * 2;
      piVar6 = (p->pClauses).pData;
      if (piVar6 == (int *)0x0) {
        piVar6 = (int *)malloc((long)iVar1 << 3);
      }
      else {
        piVar6 = (int *)realloc(piVar6,(long)iVar1 << 3);
      }
      (p->pClauses).pData = piVar6;
    }
    piVar6 = (p->pClauses).pData;
    iVar5 = (p->pClauses).iTail;
    (p->pClauses).iTail = iVar5 + 1;
    piVar6[iVar5] = 0;
    iVar5 = (p->pClauses).nSize;
    if ((p->pClauses).iTail == iVar5) {
      (p->pClauses).nSize = iVar5 * 2;
      if (piVar6 == (int *)0x0) {
        piVar6 = (int *)malloc((long)iVar5 << 3);
      }
      else {
        piVar6 = (int *)realloc(piVar6,(long)iVar5 << 3);
      }
      (p->pClauses).pData = piVar6;
    }
    piVar6 = (p->pClauses).pData;
    iVar5 = (p->pClauses).iTail;
    (p->pClauses).iTail = iVar5 + 1;
    piVar6[iVar5] = 0;
    if (iFan0 == 0) {
      if (iFan1 == 0) {
        __assert_fail("iFan1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaCSat2.c"
                      ,800,"int Cbs2_ManAnalyze(Cbs2_Man_t *, int, int, int, int)");
      }
      uVar2 = (p->pClauses).pData[iFan1];
      iVar5 = (p->pClauses).nSize;
      if (iVar5 < (int)((p->pClauses).iTail + uVar2)) {
        (p->pClauses).nSize = iVar5 * 2;
        if (piVar6 == (int *)0x0) {
          piVar6 = (int *)malloc((long)iVar5 << 3);
        }
        else {
          piVar6 = (int *)realloc(piVar6,(long)iVar5 << 3);
        }
        (p->pClauses).pData = piVar6;
      }
      if ((p->pClauses).nSize < (int)((p->pClauses).iTail + uVar2)) {
        __assert_fail("p->iTail + Plus <= p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaCSat2.c"
                      ,0x180,"void Cbs2_QueGrow(Cbs2_Que_t *, int)");
      }
      piVar6 = (p->pClauses).pData;
      uVar3 = piVar6[(long)iFan1 + 1];
      if ((int)uVar3 < 0) {
LAB_0071f2fe:
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                      ,0x12f,"int Abc_Lit2Var(int)");
      }
      if (uVar3 >> 1 != iVar) {
        __assert_fail("iVar == Abc_Lit2Var(pLits[0])",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaCSat2.c"
                      ,0x323,"int Cbs2_ManAnalyze(Cbs2_Man_t *, int, int, int, int)");
      }
      if ((p->vAssign).nSize <= iVar) goto LAB_0071f31d;
      if ((uVar3 & 1) != (int)(p->vAssign).pArray[(uint)iVar]) {
        __assert_fail("Cbs2_VarValue(p, iVar) == Abc_LitIsCompl(pLits[0])",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaCSat2.c"
                      ,0x324,"int Cbs2_ManAnalyze(Cbs2_Man_t *, int, int, int, int)");
      }
      if (0 < (int)uVar2) {
        uVar8 = 0;
        do {
          uVar3 = piVar6[(long)iFan1 + uVar8 + 1];
          if ((int)uVar3 < 0) goto LAB_0071f2fe;
          iVar5 = (p->pClauses).nSize;
          if ((p->pClauses).iTail == iVar5) {
            (p->pClauses).nSize = iVar5 * 2;
            piVar7 = (p->pClauses).pData;
            if (piVar7 == (int *)0x0) {
              piVar7 = (int *)malloc((long)iVar5 << 3);
            }
            else {
              piVar7 = (int *)realloc(piVar7,(long)iVar5 << 3);
            }
            (p->pClauses).pData = piVar7;
          }
          iVar5 = (p->pClauses).iTail;
          (p->pClauses).iTail = iVar5 + 1;
          (p->pClauses).pData[iVar5] = uVar3 >> 1;
          uVar8 = uVar8 + 1;
        } while (uVar2 != uVar8);
      }
    }
    else {
      if ((iFan0 < 0) || (iVar5 = (p->vAssign).nSize, iVar5 <= iFan0)) goto LAB_0071f31d;
      pcVar4 = (p->vAssign).pArray;
      if ('\x01' < pcVar4[(uint)iFan0]) {
        __assert_fail("Cbs2_VarIsAssigned(p, iFan0)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaCSat2.c"
                      ,0x316,"int Cbs2_ManAnalyze(Cbs2_Man_t *, int, int, int, int)");
      }
      if (iFan1 != 0) {
        if ((iFan1 < 0) || (iVar5 <= iFan1)) goto LAB_0071f31d;
        if ('\x01' < pcVar4[(uint)iFan1]) {
          __assert_fail("iFan1 == 0 || Cbs2_VarIsAssigned(p, iFan1)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaCSat2.c"
                        ,0x317,"int Cbs2_ManAnalyze(Cbs2_Man_t *, int, int, int, int)");
        }
      }
      iVar5 = (p->pClauses).nSize;
      if ((p->pClauses).iTail == iVar5) {
        (p->pClauses).nSize = iVar5 * 2;
        if (piVar6 == (int *)0x0) {
          piVar6 = (int *)malloc((long)iVar5 << 3);
        }
        else {
          piVar6 = (int *)realloc(piVar6,(long)iVar5 << 3);
        }
        (p->pClauses).pData = piVar6;
      }
      piVar6 = (p->pClauses).pData;
      iVar5 = (p->pClauses).iTail;
      (p->pClauses).iTail = iVar5 + 1;
      piVar6[iVar5] = iVar;
      iVar5 = (p->pClauses).nSize;
      if ((p->pClauses).iTail == iVar5) {
        (p->pClauses).nSize = iVar5 * 2;
        if (piVar6 == (int *)0x0) {
          piVar6 = (int *)malloc((long)iVar5 << 3);
        }
        else {
          piVar6 = (int *)realloc(piVar6,(long)iVar5 << 3);
        }
        (p->pClauses).pData = piVar6;
      }
      iVar5 = (p->pClauses).iTail;
      piVar6 = (p->pClauses).pData;
      (p->pClauses).iTail = iVar5 + 1;
      piVar6[iVar5] = iFan0;
      if (iFan1 != 0) {
        iVar5 = (p->pClauses).nSize;
        if ((p->pClauses).iTail == iVar5) {
          (p->pClauses).nSize = iVar5 * 2;
          if (piVar6 == (int *)0x0) {
            piVar6 = (int *)malloc((long)iVar5 << 3);
          }
          else {
            piVar6 = (int *)realloc(piVar6,(long)iVar5 << 3);
          }
          (p->pClauses).pData = piVar6;
        }
        iVar5 = (p->pClauses).iTail;
        (p->pClauses).iTail = iVar5 + 1;
        (p->pClauses).pData[iVar5] = iFan1;
      }
    }
    iVar5 = Cbs2_ManDeriveReason(p,Level);
    return iVar5;
  }
LAB_0071f31d:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecStr.h"
                ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
}

Assistant:

static inline int Cbs2_ManAnalyze( Cbs2_Man_t * p, int Level, int iVar, int iFan0, int iFan1 )
{
    Cbs2_Que_t * pQue = &(p->pClauses); 
    assert( Cbs2_VarIsAssigned(p, iVar) );
    assert( Cbs2_QueIsEmpty( pQue ) );
    Cbs2_QuePush( pQue, 0 );
    Cbs2_QuePush( pQue, 0 );
    if ( iFan0 ) // circuit conflict
    {
        assert( Cbs2_VarIsAssigned(p, iFan0) );
        assert( iFan1 == 0 || Cbs2_VarIsAssigned(p, iFan1) );
        Cbs2_QuePush( pQue, iVar );
        Cbs2_QuePush( pQue, iFan0 );
        if ( iFan1 )
        Cbs2_QuePush( pQue, iFan1 );
    }
    else // clause conflict
    {
        int i, * pLits, nLits = Cbs2_ClauseSize( p, iFan1 );
        assert( iFan1 );
        Cbs2_QueGrow( pQue, nLits );
        pLits = Cbs2_ClauseLits( p, iFan1 );
        assert( iVar == Abc_Lit2Var(pLits[0]) );
        assert( Cbs2_VarValue(p, iVar) == Abc_LitIsCompl(pLits[0]) );
        for ( i = 0; i < nLits; i++ )
            Cbs2_QuePush( pQue, Abc_Lit2Var(pLits[i]) );
    }
    return Cbs2_ManDeriveReason( p, Level );
}